

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

QString * __thiscall
QWizardPage::buttonText(QString *__return_storage_ptr__,QWizardPage *this,WizardButton which)

{
  QWizard *this_00;
  bool bVar1;
  QMap<int,_QString> *this_01;
  long in_FS_OFFSET;
  QString local_48;
  WizardButton local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QMap<int,_QString> *)(*(long *)&(this->super_QWidget).field_0x8 + 0x310);
  local_48.d.d = (Data *)CONCAT44(local_48.d.d._4_4_,which);
  bVar1 = QMap<int,_QString>::contains(this_01,(int *)&local_48);
  if (bVar1) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.size = 0;
    local_2c = which;
    QMap<int,_QString>::value(__return_storage_ptr__,this_01,&local_2c,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    this_00 = *(QWizard **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    if (this_00 == (QWizard *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QWizard::buttonText(__return_storage_ptr__,this_00,which);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QWizardPage::buttonText(QWizard::WizardButton which) const
{
    Q_D(const QWizardPage);

    if (d->buttonCustomTexts.contains(which))
        return d->buttonCustomTexts.value(which);

    if (wizard())
        return wizard()->buttonText(which);

    return QString();
}